

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O1

void crypto::sha256_transform::transform(hash_word *state,hash_word *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  hash_word hVar6;
  uint uVar7;
  hash_word hVar8;
  uint uVar9;
  uint uVar10;
  hash_word hVar11;
  hash_word hVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  hash_word hVar16;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_98;
  hash_word local_94;
  
  local_b4 = 0;
  uVar4 = 0xfffffffffffffff0;
  local_c0 = 0;
  hVar16 = 0;
  local_b8 = 0;
  local_c4 = 0;
  local_cc = 0;
  local_d4 = 0;
  hVar12 = 0;
  local_e0 = 0;
  local_c8 = 0;
  local_d0 = 0;
  local_d8 = 0;
  local_dc = 0;
  local_e4 = 0;
  local_e8 = 0;
  local_bc = 0;
  uVar2 = *state;
  uVar5 = state[1];
  hVar8 = state[2];
  hVar11 = state[3];
  hVar6 = state[4];
  uVar15 = state[5];
  local_98 = state[6];
  local_94 = state[7];
  do {
    if (uVar4 == 0xfffffffffffffff0) {
      local_bc = *data;
      local_e8 = data[1];
      local_e4 = data[2];
      local_dc = data[3];
      local_d8 = data[4];
      local_d0 = data[5];
      local_c8 = data[6];
    }
    else {
      local_bc = local_bc + local_d4 +
                 (local_e8 >> 3 ^
                 (local_e8 << 0xe | local_e8 >> 0x12) ^ (local_e8 << 0x19 | local_e8 >> 7)) +
                 (local_c0 >> 10 ^
                 (local_c0 << 0xd | local_c0 >> 0x13) ^ (local_c0 << 0xf | local_c0 >> 0x11));
      local_e8 = local_e8 + local_cc +
                 (local_e4 >> 3 ^
                 (local_e4 << 0xe | local_e4 >> 0x12) ^ (local_e4 << 0x19 | local_e4 >> 7)) +
                 (local_b4 >> 10 ^
                 (local_b4 << 0xd | local_b4 >> 0x13) ^ (local_b4 << 0xf | local_b4 >> 0x11));
      local_e4 = local_e4 + local_c4 +
                 (local_dc >> 3 ^
                 (local_dc << 0xe | local_dc >> 0x12) ^ (local_dc << 0x19 | local_dc >> 7)) +
                 (local_bc >> 10 ^
                 (local_bc * 0x2000 | local_bc >> 0x13) ^ (local_bc * 0x8000 | local_bc >> 0x11));
      local_dc = local_dc + local_b8 +
                 (local_d8 >> 3 ^
                 (local_d8 << 0xe | local_d8 >> 0x12) ^ (local_d8 << 0x19 | local_d8 >> 7)) +
                 (local_e8 >> 10 ^
                 (local_e8 * 0x2000 | local_e8 >> 0x13) ^ (local_e8 * 0x8000 | local_e8 >> 0x11));
      local_d8 = local_d8 + hVar16 +
                 (local_d0 >> 3 ^
                 (local_d0 << 0xe | local_d0 >> 0x12) ^ (local_d0 << 0x19 | local_d0 >> 7)) +
                 (local_e4 >> 10 ^
                 (local_e4 * 0x2000 | local_e4 >> 0x13) ^ (local_e4 * 0x8000 | local_e4 >> 0x11));
      local_d0 = local_d0 + local_c0 +
                 (local_c8 >> 3 ^
                 (local_c8 << 0xe | local_c8 >> 0x12) ^ (local_c8 << 0x19 | local_c8 >> 7)) +
                 (local_dc >> 10 ^
                 (local_dc * 0x2000 | local_dc >> 0x13) ^ (local_dc * 0x8000 | local_dc >> 0x11));
      local_c8 = local_c8 + local_b4 +
                 (local_e0 >> 3 ^
                 (local_e0 << 0xe | local_e0 >> 0x12) ^ (local_e0 << 0x19 | local_e0 >> 7)) +
                 (local_d8 >> 10 ^
                 (local_d8 * 0x2000 | local_d8 >> 0x13) ^ (local_d8 * 0x8000 | local_d8 >> 0x11));
    }
    if (uVar4 == 0xfffffffffffffff0) {
      local_e0 = data[7];
    }
    else {
      local_e0 = (hVar12 >> 3 ^ (hVar12 << 0xe | hVar12 >> 0x12) ^ (hVar12 << 0x19 | hVar12 >> 7)) +
                 local_e0 + local_bc +
                 (local_d0 >> 10 ^
                 (local_d0 << 0xd | local_d0 >> 0x13) ^ (local_d0 << 0xf | local_d0 >> 0x11));
    }
    if (uVar4 == 0xfffffffffffffff0) {
      hVar12 = data[8];
    }
    else {
      hVar12 = (local_d4 >> 3 ^
               (local_d4 << 0xe | local_d4 >> 0x12) ^ (local_d4 << 0x19 | local_d4 >> 7)) + hVar12 +
               local_e8 +
               (local_c8 >> 10 ^
               (local_c8 << 0xd | local_c8 >> 0x13) ^ (local_c8 << 0xf | local_c8 >> 0x11));
    }
    if (uVar4 == 0xfffffffffffffff0) {
      local_d4 = data[9];
    }
    else {
      local_d4 = (local_cc >> 3 ^
                 (local_cc << 0xe | local_cc >> 0x12) ^ (local_cc << 0x19 | local_cc >> 7)) +
                 local_d4 + local_e4 +
                 (local_e0 >> 10 ^
                 (local_e0 << 0xd | local_e0 >> 0x13) ^ (local_e0 << 0xf | local_e0 >> 0x11));
    }
    if (uVar4 == 0xfffffffffffffff0) {
      local_cc = data[10];
    }
    else {
      local_cc = (local_c4 >> 3 ^
                 (local_c4 << 0xe | local_c4 >> 0x12) ^ (local_c4 << 0x19 | local_c4 >> 7)) +
                 local_cc + local_dc +
                 (hVar12 >> 10 ^ (hVar12 << 0xd | hVar12 >> 0x13) ^ (hVar12 << 0xf | hVar12 >> 0x11)
                 );
    }
    if (uVar4 == 0xfffffffffffffff0) {
      local_c4 = data[0xb];
    }
    else {
      local_c4 = (local_b8 >> 3 ^
                 (local_b8 << 0xe | local_b8 >> 0x12) ^ (local_b8 << 0x19 | local_b8 >> 7)) +
                 local_c4 + local_d8 +
                 (local_d4 >> 10 ^
                 (local_d4 << 0xd | local_d4 >> 0x13) ^ (local_d4 << 0xf | local_d4 >> 0x11));
    }
    if (uVar4 == 0xfffffffffffffff0) {
      local_b8 = data[0xc];
    }
    else {
      local_b8 = (hVar16 >> 3 ^ (hVar16 << 0xe | hVar16 >> 0x12) ^ (hVar16 << 0x19 | hVar16 >> 7)) +
                 local_b8 + local_d0 +
                 (local_cc >> 10 ^
                 (local_cc << 0xd | local_cc >> 0x13) ^ (local_cc << 0xf | local_cc >> 0x11));
    }
    if (uVar4 == 0xfffffffffffffff0) {
      hVar16 = data[0xd];
    }
    else {
      hVar16 = (local_c0 >> 3 ^
               (local_c0 << 0xe | local_c0 >> 0x12) ^ (local_c0 << 0x19 | local_c0 >> 7)) + hVar16 +
               local_c8 +
               (local_c4 >> 10 ^
               (local_c4 << 0xd | local_c4 >> 0x13) ^ (local_c4 << 0xf | local_c4 >> 0x11));
    }
    if (uVar4 == 0xfffffffffffffff0) {
      local_c0 = data[0xe];
    }
    else {
      local_c0 = (local_b4 >> 3 ^
                 (local_b4 << 0xe | local_b4 >> 0x12) ^ (local_b4 << 0x19 | local_b4 >> 7)) +
                 local_c0 + local_e0 +
                 (local_b8 >> 10 ^
                 (local_b8 << 0xd | local_b8 >> 0x13) ^ (local_b8 << 0xf | local_b8 >> 0x11));
    }
    if (uVar4 == 0xfffffffffffffff0) {
      local_b4 = data[0xf];
    }
    else {
      local_b4 = (local_bc >> 3 ^
                 (local_bc << 0xe | local_bc >> 0x12) ^ (local_bc << 0x19 | local_bc >> 7)) +
                 local_b4 + hVar12 +
                 (hVar16 >> 10 ^ (hVar16 << 0xd | hVar16 >> 0x13) ^ (hVar16 << 0xf | hVar16 >> 0x11)
                 );
    }
    iVar14 = ((uVar15 ^ local_98) & hVar6 ^ local_98) + local_94 +
             ((hVar6 << 7 | hVar6 >> 0x19) ^
             (hVar6 << 0x15 | hVar6 >> 0xb) ^ (hVar6 << 0x1a | hVar6 >> 6)) + (&DAT_00158760)[uVar4]
             + local_bc;
    uVar10 = hVar11 + iVar14;
    uVar13 = ((uVar5 ^ hVar8) & (uVar2 ^ uVar5) ^ uVar5) +
             ((uVar2 << 10 | uVar2 >> 0x16) ^
             (uVar2 << 0x13 | uVar2 >> 0xd) ^ (uVar2 << 0x1e | uVar2 >> 2)) + iVar14;
    iVar14 = (&DAT_00158764)[uVar4] + local_98 + ((hVar6 ^ uVar15) & uVar10 ^ uVar15) + local_e8 +
             ((uVar10 * 0x80 | uVar10 >> 0x19) ^
             (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6));
    uVar7 = hVar8 + iVar14;
    uVar3 = ((uVar2 ^ uVar5) & (uVar13 ^ uVar2) ^ uVar2) +
            ((uVar13 * 0x400 | uVar13 >> 0x16) ^
            (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar14;
    iVar14 = (&DAT_00158768)[uVar4] + uVar15 + ((uVar10 ^ hVar6) & uVar7 ^ hVar6) + local_e4 +
             ((uVar7 * 0x80 | uVar7 >> 0x19) ^
             (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6));
    uVar5 = uVar5 + iVar14;
    uVar15 = ((uVar13 ^ uVar2) & (uVar3 ^ uVar13) ^ uVar13) +
             ((uVar3 * 0x400 | uVar3 >> 0x16) ^
             (uVar3 * 0x80000 | uVar3 >> 0xd) ^ (uVar3 * 0x40000000 | uVar3 >> 2)) + iVar14;
    iVar14 = (&DAT_0015876c)[uVar4] + hVar6 + ((uVar7 ^ uVar10) & uVar5 ^ uVar10) + local_dc +
             ((uVar5 * 0x80 | uVar5 >> 0x19) ^
             (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6));
    uVar2 = uVar2 + iVar14;
    uVar1 = ((uVar3 ^ uVar13) & (uVar15 ^ uVar3) ^ uVar3) +
            ((uVar15 * 0x400 | uVar15 >> 0x16) ^
            (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar14;
    iVar14 = (&DAT_00158770)[uVar4] + uVar10 + ((uVar5 ^ uVar7) & uVar2 ^ uVar7) + local_d8 +
             ((uVar2 * 0x80 | uVar2 >> 0x19) ^
             (uVar2 * 0x200000 | uVar2 >> 0xb) ^ (uVar2 * 0x4000000 | uVar2 >> 6));
    uVar13 = uVar13 + iVar14;
    uVar9 = ((uVar15 ^ uVar3) & (uVar1 ^ uVar15) ^ uVar15) +
            ((uVar1 * 0x400 | uVar1 >> 0x16) ^
            (uVar1 * 0x80000 | uVar1 >> 0xd) ^ (uVar1 * 0x40000000 | uVar1 >> 2)) + iVar14;
    iVar14 = (&DAT_00158774)[uVar4] + uVar7 + ((uVar2 ^ uVar5) & uVar13 ^ uVar5) + local_d0 +
             ((uVar13 * 0x80 | uVar13 >> 0x19) ^
             (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6));
    uVar3 = uVar3 + iVar14;
    uVar7 = ((uVar1 ^ uVar15) & (uVar9 ^ uVar1) ^ uVar1) +
            ((uVar9 * 0x400 | uVar9 >> 0x16) ^
            (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar14;
    iVar14 = (&DAT_00158778)[uVar4] + uVar5 + ((uVar13 ^ uVar2) & uVar3 ^ uVar2) + local_c8 +
             ((uVar3 * 0x80 | uVar3 >> 0x19) ^
             (uVar3 * 0x200000 | uVar3 >> 0xb) ^ (uVar3 * 0x4000000 | uVar3 >> 6));
    uVar15 = uVar15 + iVar14;
    uVar5 = ((uVar9 ^ uVar1) & (uVar7 ^ uVar9) ^ uVar9) +
            ((uVar7 * 0x400 | uVar7 >> 0x16) ^
            (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar14;
    iVar14 = (&DAT_0015877c)[uVar4] + uVar2 + ((uVar3 ^ uVar13) & uVar15 ^ uVar13) + local_e0 +
             ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6));
    uVar1 = uVar1 + iVar14;
    uVar10 = ((uVar7 ^ uVar9) & (uVar5 ^ uVar7) ^ uVar7) +
             ((uVar5 * 0x400 | uVar5 >> 0x16) ^
             (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar14;
    iVar14 = *(int *)(&UNK_00158780 + uVar4 * 4) + uVar13 + ((uVar15 ^ uVar3) & uVar1 ^ uVar3) +
             hVar12 + ((uVar1 * 0x80 | uVar1 >> 0x19) ^
                      (uVar1 * 0x200000 | uVar1 >> 0xb) ^ (uVar1 * 0x4000000 | uVar1 >> 6));
    uVar9 = uVar9 + iVar14;
    uVar13 = ((uVar5 ^ uVar7) & (uVar10 ^ uVar5) ^ uVar5) +
             ((uVar10 * 0x400 | uVar10 >> 0x16) ^
             (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar14;
    iVar14 = *(int *)(&UNK_00158784 + uVar4 * 4) + uVar3 + ((uVar1 ^ uVar15) & uVar9 ^ uVar15) +
             local_d4 +
             ((uVar9 * 0x80 | uVar9 >> 0x19) ^
             (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6));
    uVar7 = uVar7 + iVar14;
    uVar3 = ((uVar10 ^ uVar5) & (uVar13 ^ uVar10) ^ uVar10) +
            ((uVar13 * 0x400 | uVar13 >> 0x16) ^
            (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar14;
    iVar14 = *(int *)(&UNK_00158788 + uVar4 * 4) + uVar15 + ((uVar9 ^ uVar1) & uVar7 ^ uVar1) +
             local_cc +
             ((uVar7 * 0x80 | uVar7 >> 0x19) ^
             (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6));
    uVar5 = uVar5 + iVar14;
    uVar15 = ((uVar13 ^ uVar10) & (uVar3 ^ uVar13) ^ uVar13) +
             ((uVar3 * 0x400 | uVar3 >> 0x16) ^
             (uVar3 * 0x80000 | uVar3 >> 0xd) ^ (uVar3 * 0x40000000 | uVar3 >> 2)) + iVar14;
    iVar14 = *(int *)(&UNK_0015878c + uVar4 * 4) + uVar1 + ((uVar7 ^ uVar9) & uVar5 ^ uVar9) +
             local_c4 +
             ((uVar5 * 0x80 | uVar5 >> 0x19) ^
             (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6));
    uVar10 = uVar10 + iVar14;
    uVar2 = ((uVar3 ^ uVar13) & (uVar15 ^ uVar3) ^ uVar3) +
            ((uVar15 * 0x400 | uVar15 >> 0x16) ^
            (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar14;
    iVar14 = *(int *)(&UNK_00158790 + uVar4 * 4) + uVar9 + ((uVar5 ^ uVar7) & uVar10 ^ uVar7) +
             local_b8 +
             ((uVar10 * 0x80 | uVar10 >> 0x19) ^
             (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6));
    local_94 = uVar13 + iVar14;
    hVar11 = ((uVar15 ^ uVar3) & (uVar2 ^ uVar15) ^ uVar15) +
             ((uVar2 * 0x400 | uVar2 >> 0x16) ^
             (uVar2 * 0x80000 | uVar2 >> 0xd) ^ (uVar2 * 0x40000000 | uVar2 >> 2)) + iVar14;
    iVar14 = *(int *)(&UNK_00158794 + uVar4 * 4) + uVar7 + ((uVar10 ^ uVar5) & local_94 ^ uVar5) +
             hVar16 + ((local_94 * 0x80 | local_94 >> 0x19) ^
                      (local_94 * 0x200000 | local_94 >> 0xb) ^
                      (local_94 * 0x4000000 | local_94 >> 6));
    local_98 = uVar3 + iVar14;
    hVar8 = ((uVar2 ^ uVar15) & (hVar11 ^ uVar2) ^ uVar2) +
            ((hVar11 * 0x400 | hVar11 >> 0x16) ^
            (hVar11 * 0x80000 | hVar11 >> 0xd) ^ (hVar11 * 0x40000000 | hVar11 >> 2)) + iVar14;
    iVar14 = *(int *)(&UNK_00158798 + uVar4 * 4) + uVar5 + ((local_94 ^ uVar10) & local_98 ^ uVar10)
             + local_c0 +
             ((local_98 * 0x80 | local_98 >> 0x19) ^
             (local_98 * 0x200000 | local_98 >> 0xb) ^ (local_98 * 0x4000000 | local_98 >> 6));
    uVar15 = uVar15 + iVar14;
    uVar5 = ((hVar11 ^ uVar2) & (hVar8 ^ hVar11) ^ hVar11) +
            ((hVar8 * 0x400 | hVar8 >> 0x16) ^
            (hVar8 * 0x80000 | hVar8 >> 0xd) ^ (hVar8 * 0x40000000 | hVar8 >> 2)) + iVar14;
    iVar14 = *(int *)(&UNK_0015879c + uVar4 * 4) + uVar10 +
             ((local_98 ^ local_94) & uVar15 ^ local_94) + local_b4 +
             ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6));
    hVar6 = uVar2 + iVar14;
    uVar2 = ((uVar5 ^ hVar8) & (hVar8 ^ hVar11) ^ hVar8) +
            ((uVar5 * 0x400 | uVar5 >> 0x16) ^
            (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar14;
    uVar4 = uVar4 + 0x10;
  } while (uVar4 < 0x30);
  *state = uVar2 + *state;
  state[1] = uVar5 + state[1];
  state[2] = hVar8 + state[2];
  state[3] = hVar11 + state[3];
  state[4] = hVar6 + state[4];
  state[5] = uVar15 + state[5];
  state[6] = local_98 + state[6];
  state[7] = local_94 + state[7];
  return;
}

Assistant:

void sha256_transform::transform(hash_word * state, const hash_word * data) {
	
	#define a(i) T[(0 - i) & 7]
	#define b(i) T[(1 - i) & 7]
	#define c(i) T[(2 - i) & 7]
	#define d(i) T[(3 - i) & 7]
	#define e(i) T[(4 - i) & 7]
	#define f(i) T[(5 - i) & 7]
	#define g(i) T[(6 - i) & 7]
	#define h(i) T[(7 - i) & 7]
	
	#define blk0(i) (W[i] = data[i])
	#define blk2(i) (W[i & 15] += s1(W[(i - 2) & 15]) + W[(i - 7) & 15] + s0(W[(i - 15) & 15]))
	
	#define Ch(x, y, z) (z ^ (x & (y ^ z)))
	#define Maj(x, y, z) (y ^ ((x ^ y) & (y ^ z)))
	
	#define R(i) \
		h(i) += S1(e(i)) + Ch(e(i), f(i), g(i)) + sha256_k[i + j] + (j ? blk2(i) : blk0(i)); \
		d(i) += h(i); \
		h(i) += S0(a(i)) + Maj(a(i), b(i), c(i))
	
	#define s0(x) (util::rotr_fixed(x, 7) ^ util::rotr_fixed(x, 18) ^ (x >> 3))
	#define s1(x) (util::rotr_fixed(x, 17) ^ util::rotr_fixed(x, 19) ^ (x >> 10))
	#define S0(x) (util::rotr_fixed(x, 2) ^ util::rotr_fixed(x, 13) ^ util::rotr_fixed(x, 22))
	#define S1(x) (util::rotr_fixed(x, 6) ^ util::rotr_fixed(x, 11) ^ util::rotr_fixed(x, 25))
	
	hash_word W[16] = {0}, T[8];
	
	/* Copy context->state to working vars */
	std::memcpy(T, state, sizeof(T));
	
	/* 64 operations, partially loop unrolled */
	for(size_t j = 0; j < 64; j += 16) {
		R(0);
		R(1);
		R(2);
		R(3);
		R(4);
		R(5);
		R(6);
		R(7);
		R(8);
		R(9);
		R(10);
		R(11);
		R(12);
		R(13);
		R(14);
		R(15);
	}
	
	/* Add the working vars back into context.state[] */
	state[0] += a(0);
	state[1] += b(0);
	state[2] += c(0);
	state[3] += d(0);
	state[4] += e(0);
	state[5] += f(0);
	state[6] += g(0);
	state[7] += h(0);
	
	#undef Ch
	#undef Maj
	#undef s0
	#undef s1
	#undef S0
	#undef S1
	#undef blk0
	#undef blk1
	#undef blk2
	#undef R
	
	#undef a
	#undef b
	#undef c
	#undef d
	#undef e
	#undef f
	#undef g
	#undef h
	
}